

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleRoot.cpp
# Opt level: O3

BOOL __thiscall Js::ModuleRoot::InitFuncScoped(ModuleRoot *this,PropertyId propertyId,Var value)

{
  int iVar1;
  DynamicTypeHandler *pDVar2;
  char local_29 [8];
  bool noRedecl;
  
  local_29[0] = '\0';
  pDVar2 = DynamicObject::GetTypeHandler((DynamicObject *)this);
  iVar1 = (*pDVar2->_vptr_DynamicTypeHandler[0x1f])
                    (pDVar2,this,(ulong)(uint)propertyId,local_29,0,0);
  if ((iVar1 == 0) || (local_29[0] == '\0')) {
    DynamicObject::InitProperty
              ((DynamicObject *)this,propertyId,value,PropertyOperation_NonFixedValue,
               (PropertyValueInfo *)0x0);
  }
  return 1;
}

Assistant:

BOOL ModuleRoot::InitFuncScoped(PropertyId propertyId, Var value)
    {
        // Var binding of functions declared in eval are elided when conflicting
        // with global scope let/const variables, so do not actually set the
        // property if it exists and is a let/const variable.
        bool noRedecl = false;
        if (!GetTypeHandler()->HasRootProperty(this, propertyId, &noRedecl) || !noRedecl)
        {
            DynamicObject::InitProperty(propertyId, value, PropertyOperation_NonFixedValue);
        }
        return true;
    }